

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# editcol.c
# Opt level: O1

int ffrwrgll(char *rowlist,LONGLONG maxrows,int maxranges,int *numranges,LONGLONG *minrow,
            LONGLONG *maxrow,int *status)

{
  char cVar1;
  int iVar2;
  ushort **ppuVar3;
  long lVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  double dVar8;
  char *local_50;
  int local_44;
  char *local_40;
  LONGLONG *local_38;
  
  iVar2 = *status;
  if (iVar2 < 1) {
    if (maxrows < 1) {
      *status = 0x7e;
      pcVar7 = "Input maximum range value is <= 0 (fits_parse_ranges)";
    }
    else {
      *numranges = 0;
      local_50 = rowlist + -1;
      do {
        pcVar7 = local_50 + 1;
        local_50 = local_50 + 1;
        local_44 = maxranges;
        local_40 = rowlist;
      } while (*pcVar7 == ' ');
LAB_0013ce97:
      pcVar7 = local_50;
      cVar1 = *local_50;
      lVar5 = 1;
      if (cVar1 != '-') {
        if (cVar1 == '\0') {
          if (*numranges == 0) {
            *minrow = 1;
            *maxrow = maxrows;
            *numranges = 1;
          }
          goto LAB_0013d065;
        }
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 8) != 0) {
          dVar8 = strtod(pcVar7,&local_50);
          lVar5 = (long)(dVar8 + 0.1);
          pcVar7 = local_50;
          maxranges = local_44;
          goto LAB_0013cf0a;
        }
LAB_0013d0b2:
        *status = 0x7e;
        pcVar7 = "Syntax error in this row range list:";
LAB_0013d0c4:
        ffpmsg(pcVar7);
        pcVar7 = local_40;
        goto LAB_0013d060;
      }
LAB_0013cf0a:
      for (; cVar1 = *pcVar7, cVar1 == ' '; pcVar7 = pcVar7 + 1) {
      }
      lVar4 = lVar5;
      local_50 = pcVar7;
      if ((cVar1 != '\0') && (cVar1 != ',')) {
        if (cVar1 != '-') {
          *status = 0x7e;
          pcVar6 = "Syntax error in this row range list:";
          pcVar7 = local_40;
          goto LAB_0013d049;
        }
        do {
          cVar1 = pcVar7[1];
          pcVar7 = pcVar7 + 1;
        } while ((long)cVar1 == 0x20);
        local_50 = pcVar7;
        local_38 = maxrow;
        ppuVar3 = __ctype_b_loc();
        if ((*(byte *)((long)*ppuVar3 + (long)cVar1 * 2 + 1) & 8) == 0) {
          lVar4 = maxrows;
          maxrow = local_38;
          maxranges = local_44;
          if ((cVar1 != '\0') && (cVar1 != ',')) goto LAB_0013d0b2;
        }
        else {
          dVar8 = strtod(pcVar7,&local_50);
          lVar4 = (long)(dVar8 + 0.1);
          maxrow = local_38;
          maxranges = local_44;
        }
      }
      pcVar7 = local_40;
      iVar2 = *numranges;
      if (maxranges <= iVar2) {
        *status = 0x7e;
        pcVar7 = "Overflowed maximum number of ranges (fits_parse_ranges)";
        goto LAB_0013d060;
      }
      if (lVar5 < 1) {
        *status = 0x7e;
        pcVar7 = "Syntax error in this row range list: row number < 1";
        goto LAB_0013d0c4;
      }
      if (lVar4 < lVar5) {
        *status = 0x7e;
        pcVar6 = "Syntax error in this row range list: min > max";
        goto LAB_0013d049;
      }
      if ((iVar2 < 1) || (maxrow[(long)iVar2 + -1] < lVar5)) {
        if (lVar5 <= maxrows) {
          if (maxrows <= lVar4) {
            lVar4 = maxrows;
          }
          minrow[iVar2] = lVar5;
          maxrow[iVar2] = lVar4;
          *numranges = iVar2 + 1;
        }
        for (; *local_50 == ' '; local_50 = local_50 + 1) {
        }
        if (*local_50 == ',') {
          do {
            pcVar7 = local_50 + 1;
            pcVar6 = local_50 + 1;
            local_50 = pcVar7;
          } while (*pcVar6 == ' ');
        }
        goto LAB_0013ce97;
      }
      *status = 0x7e;
      ffpmsg("Syntax error in this row range list.  Range minimum is");
      pcVar6 = "  less than or equal to previous range maximum";
LAB_0013d049:
      ffpmsg(pcVar6);
    }
LAB_0013d060:
    ffpmsg(pcVar7);
LAB_0013d065:
    iVar2 = *status;
  }
  return iVar2;
}

Assistant:

int ffrwrgll(
      char *rowlist,      /* I - list of rows and row ranges */
      LONGLONG maxrows,       /* I - number of rows in the list */
      int maxranges,     /* I - max number of ranges to be returned */
      int *numranges,    /* O - number ranges returned */
      LONGLONG *minrow,       /* O - first row in each range */
      LONGLONG *maxrow,       /* O - last row in each range */
      int *status)        /* IO - status value */
{
/*
   parse the input list of row ranges, returning the number of ranges,
   and the min and max row value in each range. 

   The only characters allowed in the input rowlist are 
       decimal digits, minus sign, and comma (and non-significant spaces) 

   Example:  

     list = "10-20, 30-35,50"

   would return numranges = 3, minrow[] = {10, 30, 50}, maxrow[] = {20, 35, 50}

   error is returned if min value of range is > max value of range or if the
   ranges are not monotonically increasing.
*/
    char *next;
    LONGLONG minval, maxval;
    double dvalue;

    if (*status > 0)
        return(*status);

    if (maxrows <= 0 ) {
        *status = RANGE_PARSE_ERROR;
        ffpmsg("Input maximum range value is <= 0 (fits_parse_ranges)");
        return(*status);
    }

    next = rowlist;
    *numranges = 0;

    while (*next == ' ')next++;   /* skip spaces */
   
    while (*next != '\0') {

      /* find min value of next range; *next must be '-' or a digit */
      if (*next == '-') {
          minval = 1;    /* implied minrow value = 1 */
      } else if ( isdigit((int) *next) ) {

        /* read as a double, because the string to LONGLONG function */
        /* is platform dependent (strtoll, strtol, _atoI64)          */

          dvalue = strtod(next, &next);
          minval = (LONGLONG) (dvalue + 0.1);

      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      while (*next == ' ')next++;   /* skip spaces */

      /* find max value of next range; *next must be '-', or ',' */
      if (*next == '-') {
          next++;
          while (*next == ' ')next++;   /* skip spaces */

          if ( isdigit((int) *next) ) {

            /* read as a double, because the string to LONGLONG function */
            /* is platform dependent (strtoll, strtol, _atoI64)          */

              dvalue = strtod(next, &next);
              maxval = (LONGLONG) (dvalue + 0.1);

          } else if (*next == ',' || *next == '\0') {
              maxval = maxrows;  /* implied max value */
          } else {
              *status = RANGE_PARSE_ERROR;
              ffpmsg("Syntax error in this row range list:");
              ffpmsg(rowlist);
              return(*status);
          }
      } else if (*next == ',' || *next == '\0') {
          maxval = minval;  /* only a single integer in this range */
      } else {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list:");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges + 1 > maxranges) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Overflowed maximum number of ranges (fits_parse_ranges)");
          return(*status);
      }

      if (minval < 1 ) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: row number < 1");
          ffpmsg(rowlist);
          return(*status);
      }

      if (maxval < minval) {
          *status = RANGE_PARSE_ERROR;
          ffpmsg("Syntax error in this row range list: min > max");
          ffpmsg(rowlist);
          return(*status);
      }

      if (*numranges > 0) {
          if (minval <= maxrow[(*numranges) - 1]) {
             *status = RANGE_PARSE_ERROR;
             ffpmsg("Syntax error in this row range list.  Range minimum is");
             ffpmsg("  less than or equal to previous range maximum");
             ffpmsg(rowlist);
             return(*status);
         }
      }

      if (minval <= maxrows) {   /* ignore range if greater than maxrows */
          if (maxval > maxrows)
              maxval = maxrows;

           minrow[*numranges] = minval;
           maxrow[*numranges] = maxval;

           (*numranges)++;
      }

      while (*next == ' ')next++;   /* skip spaces */
      if (*next == ',') {
           next++;
           while (*next == ' ')next++;   /* skip more spaces */
      }
    }

    if (*numranges == 0) {  /* a null string was entered */
         minrow[0] = 1;
         maxrow[0] = maxrows;
         *numranges = 1;
    }

    return(*status);
}